

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_equals
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = (sysbvm_tuple_t *)*arguments;
  uVar2 = (ulong)psVar1 & 0xf;
  if (uVar2 == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    sVar3 = *psVar1;
  }
  else if ((int)uVar2 == 0xf) {
    sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
  }
  psVar1 = (sysbvm_tuple_t *)arguments[1];
  uVar2 = (ulong)psVar1 & 0xf;
  if (uVar2 == 0 && psVar1 != (sysbvm_tuple_t *)0x0) {
    sVar4 = *psVar1;
  }
  else if ((int)uVar2 == 0xf) {
    sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
  }
  else {
    sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
  }
  sVar5 = 0xf;
  if (sVar3 == sVar4) {
    sVar3 = *arguments;
    sVar4 = arguments[1];
    if ((*(long *)(sVar3 + 0x10) == *(long *)(sVar4 + 0x10)) &&
       (*(long *)(sVar3 + 0x18) == *(long *)(sVar4 + 0x18))) {
      sVar5 = (ulong)(*(long *)(sVar3 + 0x20) == *(long *)(sVar4 + 0x20)) << 4 | 0xf;
    }
  }
  return sVar5;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_equals(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    if(sysbvm_tuple_getType(context, arguments[0]) != sysbvm_tuple_getType(context, arguments[1]))
        return SYSBVM_FALSE_TUPLE;

    sysbvm_sourcePosition_t *leftSourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    sysbvm_sourcePosition_t *rightSourcePosition = (sysbvm_sourcePosition_t*)arguments[1];

    return sysbvm_tuple_boolean_encode(
        leftSourcePosition->sourceCode == rightSourcePosition->sourceCode &&
        leftSourcePosition->startIndex == rightSourcePosition->startIndex &&
        leftSourcePosition->endIndex == rightSourcePosition->endIndex
    );
}